

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_types.cpp
# Opt level: O3

void __thiscall
jaegertracing::sampling_manager::thrift::PerOperationSamplingStrategies::printTo
          (PerOperationSamplingStrategies *this,ostream *out)

{
  ostringstream o;
  char *local_1b8;
  long local_1b0;
  char local_1a8 [16];
  string local_198 [3];
  ios_base local_128 [264];
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"PerOperationSamplingStrategies(",0x1f);
  std::__ostream_insert<char,std::char_traits<char>>(out,"defaultSamplingProbability=",0x1b);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  *(undefined8 *)
   ((long)&local_198[0]._M_string_length + *(long *)(local_198[0]._M_dataplus._M_p + -0x18)) = 0x11;
  std::ostream::_M_insert<double>(this->defaultSamplingProbability);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  std::__ostream_insert<char,std::char_traits<char>>(out,local_1b8,local_1b0);
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"defaultLowerBoundTracesPerSecond=",0x21);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  *(undefined8 *)
   ((long)&local_198[0]._M_string_length + *(long *)(local_198[0]._M_dataplus._M_p + -0x18)) = 0x11;
  std::ostream::_M_insert<double>(this->defaultLowerBoundTracesPerSecond);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  std::__ostream_insert<char,std::char_traits<char>>(out,local_1b8,local_1b0);
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"perOperationStrategies=",0x17);
  apache::thrift::to_string<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy>
            (local_198,&this->perOperationStrategies);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,local_198[0]._M_dataplus._M_p,local_198[0]._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198[0]._M_dataplus._M_p != &local_198[0].field_2) {
    operator_delete(local_198[0]._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"defaultUpperBoundTracesPerSecond=",0x21);
  if (((byte)this->__isset & 1) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    *(undefined8 *)
     ((long)&local_198[0]._M_string_length + *(long *)(local_198[0]._M_dataplus._M_p + -0x18)) =
         0x11;
    std::ostream::_M_insert<double>(this->defaultUpperBoundTracesPerSecond);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base(local_128);
    std::__ostream_insert<char,std::char_traits<char>>(out,local_1b8,local_1b0);
    if (local_1b8 != local_1a8) {
      operator_delete(local_1b8);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,")",1);
  return;
}

Assistant:

void PerOperationSamplingStrategies::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "PerOperationSamplingStrategies(";
  out << "defaultSamplingProbability=" << to_string(defaultSamplingProbability);
  out << ", " << "defaultLowerBoundTracesPerSecond=" << to_string(defaultLowerBoundTracesPerSecond);
  out << ", " << "perOperationStrategies=" << to_string(perOperationStrategies);
  out << ", " << "defaultUpperBoundTracesPerSecond="; (__isset.defaultUpperBoundTracesPerSecond ? (out << to_string(defaultUpperBoundTracesPerSecond)) : (out << "<null>"));
  out << ")";
}